

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int openDatabase(char *zFilename,sqlite3 **ppDb,uint flags,char *zVfs)

{
  Db *pDVar1;
  bool bVar2;
  char *p_00;
  int iVar3;
  uint uVar4;
  sqlite3 *db;
  CollSeq *pCVar5;
  Schema *pSVar6;
  undefined8 *pAux;
  sqlite3_mutex *psVar7;
  Fts3Hash *pH;
  void *pvVar8;
  long lVar9;
  char *zFormat;
  int i;
  undefined1 *puVar10;
  undefined *p_01;
  undefined **ppuVar11;
  code *pcVar12;
  int err_code;
  void **ppvVar13;
  int rc;
  void *p;
  void *p_1;
  ulong uVar14;
  bool bVar15;
  byte bVar16;
  uint local_c4;
  char *zOpen;
  char *local_b8;
  sqlite3_mutex **local_b0;
  char *zErrMsg;
  char *local_a0;
  void *local_98;
  undefined1 local_90 [96];
  
  bVar16 = 0;
  zOpen = (char *)0x0;
  zErrMsg = (char *)0x0;
  *ppDb = (sqlite3 *)0x0;
  iVar3 = sqlite3_initialize();
  if (iVar3 != 0) {
    return iVar3;
  }
  bVar15 = true;
  if ((-1 < (short)flags) && (sqlite3Config.bCoreMutex != 0)) {
    if ((flags >> 0x10 & 1) == 0) {
      bVar15 = sqlite3Config.bFullMutex == 0;
    }
    else {
      bVar15 = false;
    }
  }
  if ((flags >> 0x12 & 1) == 0) {
    if (sqlite3Config.sharedCacheEnabled != 0) {
      flags = flags | 0x20000;
    }
  }
  else {
    flags = flags & 0xfffdffff;
  }
  local_c4 = flags & 0xfff600e7;
  local_a0 = zFilename;
  db = (sqlite3 *)sqlite3MallocZero(0x2b0);
  if (db != (sqlite3 *)0x0) {
    if (bVar15) {
      local_b0 = &db->mutex;
      psVar7 = db->mutex;
      local_b8 = zVfs;
      if (psVar7 != (sqlite3_mutex *)0x0) {
LAB_0013b2ea:
        local_b0 = &db->mutex;
        local_b8 = zVfs;
        (*sqlite3Config.mutex.xMutexEnter)(psVar7);
      }
      db->errMask = 0xff;
      db->nDb = 2;
      db->magic = 0xf03b7906;
      db->aDb = db->aDbStatic;
      (db->lookaside).bDisable = 1;
      db->aLimit[0] = 1000000000;
      db->aLimit[1] = 1000000000;
      db->aLimit[2] = 2000;
      db->aLimit[3] = 1000;
      db->aLimit[4] = 500;
      db->aLimit[5] = 250000000;
      db->aLimit[6] = 0x7f;
      db->aLimit[7] = 10;
      db->aLimit[7] = 10;
      db->aLimit[8] = 50000;
      db->aLimit[9] = 999;
      db->aLimit[10] = 1000;
      db->aLimit[0xb] = 0;
      db->autoCommit = '\x01';
      db->nextAutovac = -1;
      db->szMmap = sqlite3Config.szMmap;
      db->nextPagesize = 0;
      db->nMaxSorterMmap = 0x7fffffff;
      db->flags = db->flags | 0x48060;
      (db->aCollSeq).htsize = 0;
      (db->aCollSeq).count = 0;
      (db->aCollSeq).first = (HashElem *)0x0;
      (db->aCollSeq).ht = (_ht *)0x0;
      (db->aModule).htsize = 0;
      (db->aModule).count = 0;
      (db->aModule).first = (HashElem *)0x0;
      (db->aModule).ht = (_ht *)0x0;
      createCollation(db,"BINARY",'\x01',(void *)0x0,binCollFunc,(_func_void_void_ptr *)0x0);
      createCollation(db,"BINARY",'\x03',(void *)0x0,binCollFunc,(_func_void_void_ptr *)0x0);
      createCollation(db,"BINARY",'\x02',(void *)0x0,binCollFunc,(_func_void_void_ptr *)0x0);
      createCollation(db,"NOCASE",'\x01',(void *)0x0,nocaseCollatingFunc,(_func_void_void_ptr *)0x0)
      ;
      createCollation(db,"RTRIM",'\x01',(void *)0x1,binCollFunc,(_func_void_void_ptr *)0x0);
      if (db->mallocFailed == '\0') {
        pCVar5 = sqlite3FindCollSeq(db,'\x01',"BINARY",0);
        db->pDfltColl = pCVar5;
        db->openFlags = flags & 0xfff600e7;
        if ((0x46U >> (flags & 7) & 1) == 0) {
          iVar3 = sqlite3MisuseError(0x26850);
        }
        else {
          iVar3 = sqlite3ParseUri(local_b8,local_a0,&local_c4,(sqlite3_vfs **)db,&zOpen,&zErrMsg);
        }
        if (iVar3 == 0) {
          iVar3 = sqlite3BtreeOpen(db->pVfs,zOpen,db,&db->aDb->pBt,0,local_c4 | 0x100);
          if (iVar3 == 0) {
            sqlite3BtreeEnter(db->aDb->pBt);
            pSVar6 = sqlite3SchemaGet(db,db->aDb->pBt);
            pDVar1 = db->aDb;
            pDVar1->pSchema = pSVar6;
            if (db->mallocFailed == '\0') {
              db->enc = pSVar6->enc;
            }
            sqlite3BtreeLeave(pDVar1->pBt);
            pSVar6 = sqlite3SchemaGet(db,(Btree *)0x0);
            pDVar1 = db->aDb;
            pDVar1[1].pSchema = pSVar6;
            pDVar1->zDbSName = "main";
            pDVar1->safety_level = '\x03';
            pDVar1[1].zDbSName = "temp";
            pDVar1[1].safety_level = '\x01';
            db->magic = 0xa029a697;
            if (db->mallocFailed == '\0') {
              sqlite3Error(db,0);
              iVar3 = sqlite3_overload_function(db,"MATCH",2);
              if (iVar3 == 7) {
                sqlite3OomFault(db);
              }
              iVar3 = sqlite3_errcode(db);
              if (iVar3 == 0 && db->mallocFailed == '\0') {
                pAux = (undefined8 *)sqlite3_malloc(0x50);
                if (pAux == (undefined8 *)0x0) {
                  iVar3 = 7;
                }
                else {
                  pAux[4] = 0;
                  pAux[5] = 0;
                  *pAux = 0;
                  pAux[1] = 0;
                  pAux[2] = 0;
                  pAux[3] = 0;
                  pAux[8] = 0;
                  pAux[9] = 0;
                  pAux[6] = 0;
                  pAux[7] = 0;
                  pAux[4] = db;
                  *(undefined4 *)pAux = 2;
                  pAux[3] = fts5CreateAux;
                  pAux[1] = fts5CreateTokenizer;
                  pAux[2] = fts5FindTokenizer;
                  iVar3 = createModule(db,"fts5",(sqlite3_module *)fts5Init_fts5Mod,pAux,
                                       fts5ModuleDestroy);
                  if (((iVar3 == 0) &&
                      (iVar3 = sqlite3_create_function
                                         (db,"fts5_decode",2,1,(void *)0x0,fts5DecodeFunction,
                                          (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr
                                           *)0x0,(_func_void_sqlite3_context_ptr *)0x0), iVar3 == 0)
                      ) && (iVar3 = sqlite3_create_function
                                              (db,"fts5_decode_none",2,1,db,fts5DecodeFunction,
                                               (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr
                                                *)0x0,(_func_void_sqlite3_context_ptr *)0x0),
                           iVar3 == 0)) {
                    iVar3 = sqlite3_create_function
                                      (db,"fts5_rowid",-1,1,(void *)0x0,fts5RowidFunction,
                                       (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                       0x0,(_func_void_sqlite3_context_ptr *)0x0);
                    if (iVar3 == 0) {
                      ppuVar11 = &PTR_fts5ExprFunctionHr_00224448;
                      iVar3 = 0;
                      for (uVar14 = 0; (iVar3 == 0 && (uVar14 < 4)); uVar14 = uVar14 + 1) {
                        iVar3 = sqlite3_create_function
                                          (db,ppuVar11[-1],-1,1,pAux,
                                           (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr
                                            *)*ppuVar11,
                                           (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr
                                            *)0x0,(_func_void_sqlite3_context_ptr *)0x0);
                        ppuVar11 = ppuVar11 + 2;
                      }
                      if (iVar3 == 0) {
                        ppuVar11 = &PTR_fts5SnippetFunction_00224490;
                        iVar3 = 0;
                        for (uVar14 = 0; (iVar3 == 0 && (uVar14 < 3)); uVar14 = uVar14 + 1) {
                          iVar3 = (*(code *)pAux[3])(pAux,ppuVar11[-2],0);
                          ppuVar11 = ppuVar11 + 4;
                        }
                        if (iVar3 == 0) {
                          ppuVar11 = &PTR_anon_var_dwarf_3426e_002244e0;
                          ppvVar13 = &local_98;
                          for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
                            *ppvVar13 = *ppuVar11;
                            ppuVar11 = ppuVar11 + (ulong)bVar16 * -2 + 1;
                            ppvVar13 = ppvVar13 + (ulong)bVar16 * -2 + 1;
                          }
                          puVar10 = local_90;
                          iVar3 = 0;
                          for (uVar14 = 0; (iVar3 == 0 && (uVar14 < 3)); uVar14 = uVar14 + 1) {
                            iVar3 = (*(code *)pAux[1])(pAux,*(undefined8 *)(puVar10 + -8),pAux);
                            puVar10 = puVar10 + 0x20;
                          }
                          if (((iVar3 == 0) &&
                              (iVar3 = createModule(db,"fts5vocab",
                                                    (sqlite3_module *)sqlite3Fts5VocabInit_fts5Vocab
                                                    ,pAux,(_func_void_void_ptr *)0x0), iVar3 == 0))
                             && (iVar3 = sqlite3_create_function
                                                   (db,"fts5",1,1,pAux,fts5Fts5Func,
                                                    (
                                                  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr
                                                  *)0x0,(_func_void_sqlite3_context_ptr *)0x0),
                                iVar3 == 0)) {
                            iVar3 = sqlite3_create_function
                                              (db,"fts5_source_id",0,1,pAux,fts5SourceIdFunc,
                                               (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr
                                                *)0x0,(_func_void_sqlite3_context_ptr *)0x0);
                            goto LAB_0013b85d;
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
LAB_0013b85d:
                bVar15 = true;
                if (iVar3 == 0) {
                  if (sqlite3Autoext_0 != 0) {
                    uVar4 = 0;
                    while (bVar15) {
                      bVar2 = true;
                      if ((sqlite3Config.bCoreMutex == 0) ||
                         (psVar7 = (*sqlite3Config.mutex.xMutexAlloc)(2),
                         psVar7 == (sqlite3_mutex *)0x0)) {
                        psVar7 = (sqlite3_mutex *)0x0;
                      }
                      else {
                        (*sqlite3Config.mutex.xMutexEnter)(psVar7);
                        bVar2 = false;
                      }
                      if (sqlite3Autoext_0 <= uVar4) {
                        pcVar12 = (code *)0x0;
                      }
                      else {
                        pcVar12 = *(code **)(sqlite3Autoext_1 + (ulong)uVar4 * 8);
                      }
                      bVar15 = sqlite3Autoext_0 > uVar4;
                      if (!bVar2) {
                        (*sqlite3Config.mutex.xMutexLeave)(psVar7);
                      }
                      local_98 = (void *)0x0;
                      if ((pcVar12 != (code *)0x0) &&
                         (iVar3 = (*pcVar12)(db,&local_98,&sqlite3Apis), iVar3 != 0)) {
                        bVar15 = false;
                        sqlite3ErrorWithMsg(db,iVar3,"automatic extension loading failed: %s");
                      }
                      sqlite3_free(local_98);
                      uVar4 = uVar4 + 1;
                    }
                  }
                  iVar3 = sqlite3_errcode(db);
                  if (iVar3 != 0) goto LAB_0013bcef;
                  iVar3 = 0;
                }
              }
              if (((iVar3 == 0) && (db->mallocFailed == '\0')) &&
                 (iVar3 = sqlite3_create_module
                                    (db,"fts4aux",
                                     (sqlite3_module *)sqlite3Fts3InitAux_fts3aux_module,(void *)0x0
                                    ), iVar3 == 0)) {
                pH = (Fts3Hash *)sqlite3_malloc(0x20);
                iVar3 = 7;
                if (pH != (Fts3Hash *)0x0) {
                  pH->keyClass = '\x01';
                  pH->copyKey = '\x01';
                  pH->ht = (_fts3ht *)0x0;
                  *(undefined8 *)&pH->count = 0;
                  *(undefined8 *)((long)&pH->first + 4) = 0;
                  iVar3 = 7;
                  pvVar8 = sqlite3Fts3HashInsert(pH,"simple",7,&simpleTokenizerModule);
                  if (pvVar8 == (void *)0x0) {
                    iVar3 = 7;
                    pvVar8 = sqlite3Fts3HashInsert(pH,"porter",7,&porterTokenizerModule);
                    if (((((pvVar8 == (void *)0x0) &&
                          (pvVar8 = sqlite3Fts3HashInsert
                                              (pH,"unicode61",10,sqlite3Fts3UnicodeTokenizer_module)
                          , pvVar8 == (void *)0x0)) &&
                         ((iVar3 = sqlite3_create_function
                                             (db,"fts3_tokenizer",1,5,pH,fts3TokenizerFunc,
                                              (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr
                                               *)0x0,(_func_void_sqlite3_context_ptr *)0x0),
                          iVar3 == 0 &&
                          ((iVar3 = sqlite3_create_function
                                              (db,"fts3_tokenizer",2,5,pH,fts3TokenizerFunc,
                                               (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr
                                                *)0x0,(_func_void_sqlite3_context_ptr *)0x0),
                           iVar3 == 0 &&
                           (iVar3 = sqlite3_overload_function(db,"snippet",-1), iVar3 == 0)))))) &&
                        (iVar3 = sqlite3_overload_function(db,"offsets",1), iVar3 == 0)) &&
                       (((iVar3 = sqlite3_overload_function(db,"matchinfo",1), iVar3 == 0 &&
                         (iVar3 = sqlite3_overload_function(db,"matchinfo",2), iVar3 == 0)) &&
                        (iVar3 = sqlite3_overload_function(db,"optimize",1), iVar3 == 0)))) {
                      iVar3 = createModule(db,"fts3",&fts3Module,pH,hashDestroy);
                      if ((iVar3 == 0) &&
                         (iVar3 = createModule(db,"fts4",&fts3Module,pH,(_func_void_void_ptr *)0x0),
                         iVar3 == 0)) {
                        iVar3 = sqlite3_create_module
                                          (db,"fts3tokenize",
                                           (sqlite3_module *)sqlite3Fts3InitTok_fts3tok_module,pH);
                      }
                      goto LAB_0013bb02;
                    }
                  }
                  sqlite3Fts3HashClear(pH);
                  sqlite3_free(pH);
                }
              }
LAB_0013bb02:
              if (((db->mallocFailed == '\0') && (iVar3 == 0)) &&
                 ((iVar3 = sqlite3_create_function
                                     (db,"rtreenode",2,1,(void *)0x0,rtreenode,
                                      (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                      0x0,(_func_void_sqlite3_context_ptr *)0x0), iVar3 == 0 &&
                  (((iVar3 = sqlite3_create_function
                                       (db,"rtreedepth",1,1,(void *)0x0,rtreedepth,
                                        (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                        0x0,(_func_void_sqlite3_context_ptr *)0x0), iVar3 == 0 &&
                    (iVar3 = sqlite3_create_function
                                       (db,"rtreecheck",-1,1,(void *)0x0,rtreecheck,
                                        (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                        0x0,(_func_void_sqlite3_context_ptr *)0x0), iVar3 == 0)) &&
                   (iVar3 = createModule(db,"rtree",&rtreeModule,(void *)0x0,
                                         (_func_void_void_ptr *)0x0), iVar3 == 0)))))) {
                iVar3 = createModule(db,"rtree_i32",&rtreeModule,(void *)0x1,
                                     (_func_void_void_ptr *)0x0);
              }
              if ((db->mallocFailed == '\0') && (iVar3 == 0)) {
                uVar14 = 0;
                p_01 = &DAT_00224b6c;
                iVar3 = 0;
                while ((uVar14 < 0xf && (iVar3 == 0))) {
                  iVar3 = sqlite3_create_function
                                    (db,*(char **)(p_01 + -0xc),*(int *)(p_01 + -4),0x801,p_01,
                                     *(_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **)
                                      (p_01 + 4),
                                     (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0
                                     ,(_func_void_sqlite3_context_ptr *)0x0);
                  uVar14 = uVar14 + 1;
                  p_01 = p_01 + 0x18;
                }
                ppuVar11 = &PTR_jsonArrayValue_00224cf0;
                uVar14 = 0;
                while ((uVar14 < 2 && (iVar3 == 0))) {
                  iVar3 = sqlite3_create_window_function
                                    (db,ppuVar11[-4],*(int *)(ppuVar11 + -3),0x801,(void *)0x0,
                                     (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                     ppuVar11[-2],(_func_void_sqlite3_context_ptr *)ppuVar11[-1],
                                     (_func_void_sqlite3_context_ptr *)*ppuVar11,jsonGroupInverse,
                                     (_func_void_void_ptr *)0x0);
                  uVar14 = uVar14 + 1;
                  ppuVar11 = ppuVar11 + 5;
                }
                ppuVar11 = &PTR_jsonEachModule_00224d28;
                uVar14 = 0;
                while ((uVar14 < 2 && (iVar3 == 0))) {
                  iVar3 = sqlite3_create_module
                                    (db,ppuVar11[-1],(sqlite3_module *)*ppuVar11,(void *)0x0);
                  uVar14 = uVar14 + 1;
                  ppuVar11 = ppuVar11 + 2;
                }
              }
              if (iVar3 != 0) {
                sqlite3Error(db,iVar3);
              }
              setupLookaside(db,(void *)0x0,sqlite3Config.szLookaside,sqlite3Config.nLookaside);
              sqlite3_wal_autocheckpoint(db,1000);
            }
          }
          else {
            err_code = 7;
            if (iVar3 != 0xc0a) {
              err_code = iVar3;
            }
            sqlite3Error(db,err_code);
          }
        }
        else {
          if (iVar3 == 7) {
            sqlite3OomFault(db);
          }
          p_00 = zErrMsg;
          zFormat = "%s";
          if (zErrMsg == (char *)0x0) {
            zFormat = (char *)0x0;
          }
          sqlite3ErrorWithMsg(db,iVar3,zFormat,zErrMsg);
          sqlite3_free(p_00);
        }
      }
LAB_0013bcef:
      if (*local_b0 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(*local_b0);
      }
      goto LAB_0013bd02;
    }
    if (sqlite3Config.bCoreMutex == 0) {
      db->mutex = (sqlite3_mutex *)0x0;
    }
    else {
      psVar7 = (*sqlite3Config.mutex.xMutexAlloc)(1);
      db->mutex = psVar7;
      if (psVar7 != (sqlite3_mutex *)0x0) goto LAB_0013b2ea;
    }
    sqlite3_free(db);
  }
  db = (sqlite3 *)0x0;
LAB_0013bd02:
  uVar4 = sqlite3_errcode(db);
  if (uVar4 != 0) {
    if (uVar4 == 7) {
      sqlite3_close(db);
      db = (sqlite3 *)0x0;
    }
    else {
      db->magic = 0x4b771290;
    }
  }
  *ppDb = db;
  sqlite3_free(zOpen);
  return uVar4 & 0xff;
}

Assistant:

static int openDatabase(
  const char *zFilename, /* Database filename UTF-8 encoded */
  sqlite3 **ppDb,        /* OUT: Returned database handle */
  unsigned int flags,    /* Operational flags */
  const char *zVfs       /* Name of the VFS to use */
){
  sqlite3 *db;                    /* Store allocated handle here */
  int rc;                         /* Return code */
  int isThreadsafe;               /* True for threadsafe connections */
  char *zOpen = 0;                /* Filename argument to pass to BtreeOpen() */
  char *zErrMsg = 0;              /* Error message from sqlite3ParseUri() */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppDb==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppDb = 0;
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ) return rc;
#endif

  if( sqlite3GlobalConfig.bCoreMutex==0 ){
    isThreadsafe = 0;
  }else if( flags & SQLITE_OPEN_NOMUTEX ){
    isThreadsafe = 0;
  }else if( flags & SQLITE_OPEN_FULLMUTEX ){
    isThreadsafe = 1;
  }else{
    isThreadsafe = sqlite3GlobalConfig.bFullMutex;
  }

  if( flags & SQLITE_OPEN_PRIVATECACHE ){
    flags &= ~SQLITE_OPEN_SHAREDCACHE;
  }else if( sqlite3GlobalConfig.sharedCacheEnabled ){
    flags |= SQLITE_OPEN_SHAREDCACHE;
  }

  /* Remove harmful bits from the flags parameter
  **
  ** The SQLITE_OPEN_NOMUTEX and SQLITE_OPEN_FULLMUTEX flags were
  ** dealt with in the previous code block.  Besides these, the only
  ** valid input flags for sqlite3_open_v2() are SQLITE_OPEN_READONLY,
  ** SQLITE_OPEN_READWRITE, SQLITE_OPEN_CREATE, SQLITE_OPEN_SHAREDCACHE,
  ** SQLITE_OPEN_PRIVATECACHE, and some reserved bits.  Silently mask
  ** off all other flags.
  */
  flags &=  ~( SQLITE_OPEN_DELETEONCLOSE |
               SQLITE_OPEN_EXCLUSIVE |
               SQLITE_OPEN_MAIN_DB |
               SQLITE_OPEN_TEMP_DB | 
               SQLITE_OPEN_TRANSIENT_DB | 
               SQLITE_OPEN_MAIN_JOURNAL | 
               SQLITE_OPEN_TEMP_JOURNAL | 
               SQLITE_OPEN_SUBJOURNAL | 
               SQLITE_OPEN_MASTER_JOURNAL |
               SQLITE_OPEN_NOMUTEX |
               SQLITE_OPEN_FULLMUTEX |
               SQLITE_OPEN_WAL
             );

  /* Allocate the sqlite data structure */
  db = sqlite3MallocZero( sizeof(sqlite3) );
  if( db==0 ) goto opendb_out;
  if( isThreadsafe 
#ifdef SQLITE_ENABLE_MULTITHREADED_CHECKS
   || sqlite3GlobalConfig.bCoreMutex
#endif
  ){
    db->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_RECURSIVE);
    if( db->mutex==0 ){
      sqlite3_free(db);
      db = 0;
      goto opendb_out;
    }
    if( isThreadsafe==0 ){
      sqlite3MutexWarnOnContention(db->mutex);
    }
  }
  sqlite3_mutex_enter(db->mutex);
  db->errMask = 0xff;
  db->nDb = 2;
  db->magic = SQLITE_MAGIC_BUSY;
  db->aDb = db->aDbStatic;
  db->lookaside.bDisable = 1;

  assert( sizeof(db->aLimit)==sizeof(aHardLimit) );
  memcpy(db->aLimit, aHardLimit, sizeof(db->aLimit));
  db->aLimit[SQLITE_LIMIT_WORKER_THREADS] = SQLITE_DEFAULT_WORKER_THREADS;
  db->autoCommit = 1;
  db->nextAutovac = -1;
  db->szMmap = sqlite3GlobalConfig.szMmap;
  db->nextPagesize = 0;
  db->nMaxSorterMmap = 0x7FFFFFFF;
  db->flags |= SQLITE_ShortColNames | SQLITE_EnableTrigger | SQLITE_CacheSpill
#if !defined(SQLITE_DEFAULT_AUTOMATIC_INDEX) || SQLITE_DEFAULT_AUTOMATIC_INDEX
                 | SQLITE_AutoIndex
#endif
#if SQLITE_DEFAULT_CKPTFULLFSYNC
                 | SQLITE_CkptFullFSync
#endif
#if SQLITE_DEFAULT_FILE_FORMAT<4
                 | SQLITE_LegacyFileFmt
#endif
#ifdef SQLITE_ENABLE_LOAD_EXTENSION
                 | SQLITE_LoadExtension
#endif
#if SQLITE_DEFAULT_RECURSIVE_TRIGGERS
                 | SQLITE_RecTriggers
#endif
#if defined(SQLITE_DEFAULT_FOREIGN_KEYS) && SQLITE_DEFAULT_FOREIGN_KEYS
                 | SQLITE_ForeignKeys
#endif
#if defined(SQLITE_REVERSE_UNORDERED_SELECTS)
                 | SQLITE_ReverseOrder
#endif
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
                 | SQLITE_CellSizeCk
#endif
#if defined(SQLITE_ENABLE_FTS3_TOKENIZER)
                 | SQLITE_Fts3Tokenizer
#endif
#if defined(SQLITE_ENABLE_QPSG)
                 | SQLITE_EnableQPSG
#endif
#if defined(SQLITE_DEFAULT_DEFENSIVE)
                 | SQLITE_Defensive
#endif
      ;
  sqlite3HashInit(&db->aCollSeq);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3HashInit(&db->aModule);
#endif

  /* Add the default collation sequence BINARY. BINARY works for both UTF-8
  ** and UTF-16, so add a version for each to avoid any unnecessary
  ** conversions. The only error that can occur here is a malloc() failure.
  **
  ** EVIDENCE-OF: R-52786-44878 SQLite defines three built-in collating
  ** functions:
  */
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF8, 0, binCollFunc, 0);
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF16BE, 0, binCollFunc, 0);
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF16LE, 0, binCollFunc, 0);
  createCollation(db, "NOCASE", SQLITE_UTF8, 0, nocaseCollatingFunc, 0);
  createCollation(db, "RTRIM", SQLITE_UTF8, (void*)1, binCollFunc, 0);
  if( db->mallocFailed ){
    goto opendb_out;
  }
  /* EVIDENCE-OF: R-08308-17224 The default collating function for all
  ** strings is BINARY. 
  */
  db->pDfltColl = sqlite3FindCollSeq(db, SQLITE_UTF8, sqlite3StrBINARY, 0);
  assert( db->pDfltColl!=0 );

  /* Parse the filename/URI argument
  **
  ** Only allow sensible combinations of bits in the flags argument.  
  ** Throw an error if any non-sense combination is used.  If we
  ** do not block illegal combinations here, it could trigger
  ** assert() statements in deeper layers.  Sensible combinations
  ** are:
  **
  **  1:  SQLITE_OPEN_READONLY
  **  2:  SQLITE_OPEN_READWRITE
  **  6:  SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE
  */
  db->openFlags = flags;
  assert( SQLITE_OPEN_READONLY  == 0x01 );
  assert( SQLITE_OPEN_READWRITE == 0x02 );
  assert( SQLITE_OPEN_CREATE    == 0x04 );
  testcase( (1<<(flags&7))==0x02 ); /* READONLY */
  testcase( (1<<(flags&7))==0x04 ); /* READWRITE */
  testcase( (1<<(flags&7))==0x40 ); /* READWRITE | CREATE */
  if( ((1<<(flags&7)) & 0x46)==0 ){
    rc = SQLITE_MISUSE_BKPT;  /* IMP: R-65497-44594 */
  }else{
    rc = sqlite3ParseUri(zVfs, zFilename, &flags, &db->pVfs, &zOpen, &zErrMsg);
  }
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
    sqlite3ErrorWithMsg(db, rc, zErrMsg ? "%s" : 0, zErrMsg);
    sqlite3_free(zErrMsg);
    goto opendb_out;
  }

  /* Open the backend database driver */
  rc = sqlite3BtreeOpen(db->pVfs, zOpen, db, &db->aDb[0].pBt, 0,
                        flags | SQLITE_OPEN_MAIN_DB);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    sqlite3Error(db, rc);
    goto opendb_out;
  }
  sqlite3BtreeEnter(db->aDb[0].pBt);
  db->aDb[0].pSchema = sqlite3SchemaGet(db, db->aDb[0].pBt);
  if( !db->mallocFailed ) ENC(db) = SCHEMA_ENC(db);
  sqlite3BtreeLeave(db->aDb[0].pBt);
  db->aDb[1].pSchema = sqlite3SchemaGet(db, 0);

  /* The default safety_level for the main database is FULL; for the temp
  ** database it is OFF. This matches the pager layer defaults.  
  */
  db->aDb[0].zDbSName = "main";
  db->aDb[0].safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  db->aDb[1].zDbSName = "temp";
  db->aDb[1].safety_level = PAGER_SYNCHRONOUS_OFF;

  db->magic = SQLITE_MAGIC_OPEN;
  if( db->mallocFailed ){
    goto opendb_out;
  }

  /* Register all built-in functions, but do not attempt to read the
  ** database schema yet. This is delayed until the first time the database
  ** is accessed.
  */
  sqlite3Error(db, SQLITE_OK);
  sqlite3RegisterPerConnectionBuiltinFunctions(db);
  rc = sqlite3_errcode(db);

#ifdef SQLITE_ENABLE_FTS5
  /* Register any built-in FTS5 module before loading the automatic
  ** extensions. This allows automatic extensions to register FTS5 
  ** tokenizers and auxiliary functions.  */
  if( !db->mallocFailed && rc==SQLITE_OK ){
    rc = sqlite3Fts5Init(db);
  }
#endif

  /* Load automatic extensions - extensions that have been registered
  ** using the sqlite3_automatic_extension() API.
  */
  if( rc==SQLITE_OK ){
    sqlite3AutoLoadExtensions(db);
    rc = sqlite3_errcode(db);
    if( rc!=SQLITE_OK ){
      goto opendb_out;
    }
  }

#ifdef SQLITE_ENABLE_FTS1
  if( !db->mallocFailed ){
    extern int sqlite3Fts1Init(sqlite3*);
    rc = sqlite3Fts1Init(db);
  }
#endif

#ifdef SQLITE_ENABLE_FTS2
  if( !db->mallocFailed && rc==SQLITE_OK ){
    extern int sqlite3Fts2Init(sqlite3*);
    rc = sqlite3Fts2Init(db);
  }
#endif

#ifdef SQLITE_ENABLE_FTS3 /* automatically defined by SQLITE_ENABLE_FTS4 */
  if( !db->mallocFailed && rc==SQLITE_OK ){
    rc = sqlite3Fts3Init(db);
  }
#endif

#if defined(SQLITE_ENABLE_ICU) || defined(SQLITE_ENABLE_ICU_COLLATIONS)
  if( !db->mallocFailed && rc==SQLITE_OK ){
    rc = sqlite3IcuInit(db);
  }
#endif

#ifdef SQLITE_ENABLE_RTREE
  if( !db->mallocFailed && rc==SQLITE_OK){
    rc = sqlite3RtreeInit(db);
  }
#endif

#ifdef SQLITE_ENABLE_DBPAGE_VTAB
  if( !db->mallocFailed && rc==SQLITE_OK){
    rc = sqlite3DbpageRegister(db);
  }
#endif

#ifdef SQLITE_ENABLE_DBSTAT_VTAB
  if( !db->mallocFailed && rc==SQLITE_OK){
    rc = sqlite3DbstatRegister(db);
  }
#endif

#ifdef SQLITE_ENABLE_JSON1
  if( !db->mallocFailed && rc==SQLITE_OK){
    rc = sqlite3Json1Init(db);
  }
#endif

#ifdef SQLITE_ENABLE_STMTVTAB
  if( !db->mallocFailed && rc==SQLITE_OK){
    rc = sqlite3StmtVtabInit(db);
  }
#endif

  /* -DSQLITE_DEFAULT_LOCKING_MODE=1 makes EXCLUSIVE the default locking
  ** mode.  -DSQLITE_DEFAULT_LOCKING_MODE=0 make NORMAL the default locking
  ** mode.  Doing nothing at all also makes NORMAL the default.
  */
#ifdef SQLITE_DEFAULT_LOCKING_MODE
  db->dfltLockMode = SQLITE_DEFAULT_LOCKING_MODE;
  sqlite3PagerLockingMode(sqlite3BtreePager(db->aDb[0].pBt),
                          SQLITE_DEFAULT_LOCKING_MODE);
#endif

  if( rc ) sqlite3Error(db, rc);

  /* Enable the lookaside-malloc subsystem */
  setupLookaside(db, 0, sqlite3GlobalConfig.szLookaside,
                        sqlite3GlobalConfig.nLookaside);

  sqlite3_wal_autocheckpoint(db, SQLITE_DEFAULT_WAL_AUTOCHECKPOINT);

opendb_out:
  if( db ){
    assert( db->mutex!=0 || isThreadsafe==0
           || sqlite3GlobalConfig.bFullMutex==0 );
    sqlite3_mutex_leave(db->mutex);
  }
  rc = sqlite3_errcode(db);
  assert( db!=0 || rc==SQLITE_NOMEM );
  if( rc==SQLITE_NOMEM ){
    sqlite3_close(db);
    db = 0;
  }else if( rc!=SQLITE_OK ){
    db->magic = SQLITE_MAGIC_SICK;
  }
  *ppDb = db;
#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Opening a db handle. Fourth parameter is passed 0. */
    void *pArg = sqlite3GlobalConfig.pSqllogArg;
    sqlite3GlobalConfig.xSqllog(pArg, db, zFilename, 0);
  }
#endif
#if defined(SQLITE_HAS_CODEC)
  if( rc==SQLITE_OK ) sqlite3CodecQueryParameters(db, 0, zOpen);
#endif
  sqlite3_free(zOpen);
  return rc & 0xff;
}